

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall
QXmlStreamWriterPrivate::writeNamespaceDeclaration
          (QXmlStreamWriterPrivate *this,NamespaceDeclaration *namespaceDeclaration)

{
  void *pvVar1;
  const_pointer pvVar2;
  ulong uVar3;
  size_t in_RCX;
  
  if ((namespaceDeclaration->prefix).m_size == 0) {
    pvVar1 = (void *)QtPrivate::lengthHelperContainer<char,9ul>((char (*) [9])" xmlns=\"");
    write(this,0x519b93,pvVar1,in_RCX);
    pvVar2 = QtPrivate::XmlStringRef::data(&namespaceDeclaration->namespaceUri);
    uVar3 = QtPrivate::XmlStringRef::size(&namespaceDeclaration->namespaceUri);
    write(this,(int)pvVar2,(void *)(uVar3 | 0x8000000000000000),in_RCX);
    pvVar1 = (void *)QtPrivate::lengthHelperContainer<char,2ul>((char (*) [2])0x466b4f);
  }
  else {
    pvVar1 = (void *)QtPrivate::lengthHelperContainer<char,8ul>((char (*) [8])" xmlns:");
    write(this,0x519b9c,pvVar1,in_RCX);
    pvVar2 = QtPrivate::XmlStringRef::data(&namespaceDeclaration->prefix);
    uVar3 = QtPrivate::XmlStringRef::size(&namespaceDeclaration->prefix);
    write(this,(int)pvVar2,(void *)(uVar3 | 0x8000000000000000),in_RCX);
    pvVar1 = (void *)QtPrivate::lengthHelperContainer<char,3ul>((char (*) [3])0x4683ff);
    write(this,0x4683ff,pvVar1,in_RCX);
    pvVar2 = QtPrivate::XmlStringRef::data(&namespaceDeclaration->namespaceUri);
    uVar3 = QtPrivate::XmlStringRef::size(&namespaceDeclaration->namespaceUri);
    write(this,(int)pvVar2,(void *)(uVar3 | 0x8000000000000000),in_RCX);
    pvVar1 = (void *)QtPrivate::lengthHelperContainer<char,2ul>((char (*) [2])0x466b4f);
  }
  write(this,0x466b4f,pvVar1,in_RCX);
  this->field_0x79 = this->field_0x79 | 2;
  return;
}

Assistant:

void QXmlStreamWriterPrivate::writeNamespaceDeclaration(const NamespaceDeclaration &namespaceDeclaration) {
    if (namespaceDeclaration.prefix.isEmpty()) {
        write(" xmlns=\"");
        write(namespaceDeclaration.namespaceUri);
        write("\"");
    } else {
        write(" xmlns:");
        write(namespaceDeclaration.prefix);
        write("=\"");
        write(namespaceDeclaration.namespaceUri);
        write("\"");
    }
    didWriteAnyToken = true;
}